

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlValidGetValidElements(void)

{
  int iVar1;
  int iVar2;
  int val;
  xmlNodePtr val_00;
  xmlNodePtr val_01;
  xmlChar **val_02;
  int local_4c;
  int n_max;
  int max;
  int n_names;
  xmlChar **names;
  int n_next;
  xmlNode *next;
  int n_prev;
  xmlNode *prev;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (next._4_4_ = 0; (int)next._4_4_ < 3; next._4_4_ = next._4_4_ + 1) {
    for (names._4_4_ = 0; (int)names._4_4_ < 3; names._4_4_ = names._4_4_ + 1) {
      for (n_max = 0; n_max < 1; n_max = n_max + 1) {
        for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
          iVar1 = xmlMemBlocks();
          val_00 = gen_xmlNodePtr(next._4_4_,0);
          val_01 = gen_xmlNodePtr(names._4_4_,1);
          val_02 = gen_const_xmlChar_ptr_ptr(n_max,2);
          iVar2 = gen_int(local_4c,3);
          val = xmlValidGetValidElements(val_00,val_01,val_02,iVar2);
          desret_int(val);
          call_tests = call_tests + 1;
          des_xmlNodePtr(next._4_4_,val_00,0);
          des_xmlNodePtr(names._4_4_,val_01,1);
          des_const_xmlChar_ptr_ptr(n_max,val_02,2);
          des_int(local_4c,iVar2,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlValidGetValidElements",
                   (ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)next._4_4_);
            printf(" %d",(ulong)names._4_4_);
            printf(" %d",(ulong)(uint)n_max);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlValidGetValidElements(void) {
    int test_ret = 0;

#if defined(LIBXML_VALID_ENABLED)
#ifdef LIBXML_VALID_ENABLED
    int mem_base;
    int ret_val;
    xmlNode * prev; /* an element to insert after */
    int n_prev;
    xmlNode * next; /* an element to insert next */
    int n_next;
    xmlChar ** names; /* an array to store the list of child names */
    int n_names;
    int max; /* the size of the array */
    int n_max;

    for (n_prev = 0;n_prev < gen_nb_xmlNodePtr;n_prev++) {
    for (n_next = 0;n_next < gen_nb_xmlNodePtr;n_next++) {
    for (n_names = 0;n_names < gen_nb_const_xmlChar_ptr_ptr;n_names++) {
    for (n_max = 0;n_max < gen_nb_int;n_max++) {
        mem_base = xmlMemBlocks();
        prev = gen_xmlNodePtr(n_prev, 0);
        next = gen_xmlNodePtr(n_next, 1);
        names = gen_const_xmlChar_ptr_ptr(n_names, 2);
        max = gen_int(n_max, 3);

        ret_val = xmlValidGetValidElements(prev, next, (const xmlChar **)names, max);
        desret_int(ret_val);
        call_tests++;
        des_xmlNodePtr(n_prev, prev, 0);
        des_xmlNodePtr(n_next, next, 1);
        des_const_xmlChar_ptr_ptr(n_names, (const xmlChar **)names, 2);
        des_int(n_max, max, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlValidGetValidElements",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_prev);
            printf(" %d", n_next);
            printf(" %d", n_names);
            printf(" %d", n_max);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;
#endif
#endif

    return(test_ret);
}